

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoozdedZomby.cpp
# Opt level: O0

void __thiscall BoozdedZomby::Zomby::runOnce(Zomby *this,shared_ptr<Common::Listener> *listener)

{
  bool bVar1;
  runtime_error *this_00;
  enable_shared_from_this<BoozdedZomby::Zomby> local_40;
  thread local_30 [3];
  shared_ptr<Common::Listener> *local_18;
  shared_ptr<Common::Listener> *listener_local;
  Zomby *this_local;
  
  local_18 = listener;
  listener_local = (shared_ptr<Common::Listener> *)this;
  bVar1 = std::atomic::operator_cast_to_bool((atomic *)&this->_semaphore);
  if (!bVar1) {
    std::shared_ptr<Common::Listener>::operator=(&this->_listener,listener);
    std::atomic<bool>::operator=(&this->_semaphore,true);
    std::enable_shared_from_this<BoozdedZomby::Zomby>::shared_from_this(&local_40);
    std::thread::thread<BoozdedZomby::Zomby::runOnce(std::shared_ptr<Common::Listener>)::__0,,void>
              (local_30,(type *)&local_40);
    std::thread::operator=(&this->_thread,local_30);
    std::thread::~thread(local_30);
    runOnce(std::shared_ptr<Common::Listener>)::$_0::~__0((__0 *)&local_40);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"BoozdedZomby::Zomby::runOnce() called twice");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Zomby::runOnce(std::shared_ptr<Common::Listener> listener)
{
    if (_semaphore) {
        throw std::runtime_error("BoozdedZomby::Zomby::runOnce() called twice");
    }

    _listener = listener;
    _semaphore = true;

    _thread = std::thread([shis = shared_from_this()]() {
        while (shis && shis->_semaphore && shis->_listener) {
            auto handler = [shis](auto errorCode) {
                if (shis && shis->_listener && errorCode == boozd::azzio::io_context::error_code::no_error) {
                    std::ostringstream buf;
                    buf << "BoozdedZomby has got a fresh data: ";
                    for (auto const &elem : shis->_buffer)
                        buf << elem << ' ';
                    buf << std::endl;

                    shis->_listener->processData(std::make_shared<Common::Listener::Data>(buf.str()));
                }
            };
            shis->_buffer.clear();
            shis->_context.async_read(shis->_stream, shis->_buffer, handler);
            shis->_context.run();
        }
    });
}